

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O2

void __thiscall nuraft::asio_service::asio_service(asio_service *this,options *_opt,ptr<logger> *_l)

{
  asio_service_impl *this_00;
  __shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  (this->super_delayed_task_scheduler)._vptr_delayed_task_scheduler =
       (_func_int **)&PTR__asio_service_002a9160;
  (this->super_rpc_client_factory)._vptr_rpc_client_factory =
       (_func_int **)&PTR__asio_service_002a9198;
  this_00 = (asio_service_impl *)operator_new(0x348);
  std::__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,&_l->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>);
  asio_service_impl::asio_service_impl(this_00,_opt,(ptr<logger> *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  this->impl_ = this_00;
  std::__shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>,
             &_l->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

asio_service::asio_service(const options& _opt, ptr<logger> _l)
    : impl_(new asio_service_impl(_opt, _l))
    , l_(_l)
    {}